

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontTrueType.cpp
# Opt level: O3

EStatusCode __thiscall
WrittenFontTrueType::WriteState
          (WrittenFontTrueType *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EStatusCode EVar2;
  DictionaryContext *this_00;
  string local_40;
  
  EVar2 = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  if (EVar2 == eSuccess) {
    this_00 = ObjectsContext::StartDictionary(inStateWriter);
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Type","");
    DictionaryContext::WriteKey(this_00,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"WrittenFontTrueType","");
    DictionaryContext::WriteNameValue(this_00,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    EVar2 = AbstractWrittenFont::WriteStateInDictionary
                      (&this->super_AbstractWrittenFont,inStateWriter,this_00);
    if (EVar2 == eSuccess) {
      ObjectsContext::EndDictionary(inStateWriter,this_00);
      ObjectsContext::EndIndirectObject(inStateWriter);
      EVar2 = AbstractWrittenFont::WriteStateAfterDictionary
                        (&this->super_AbstractWrittenFont,inStateWriter);
    }
  }
  return EVar2;
}

Assistant:

EStatusCode WrittenFontTrueType::WriteState(ObjectsContext* inStateWriter,ObjectIDType inObjectID)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);
	if(status != PDFHummus::eSuccess)
		return status;

	DictionaryContext* writtenFontDictionary = inStateWriter->StartDictionary();

	writtenFontDictionary->WriteKey("Type");
	writtenFontDictionary->WriteNameValue("WrittenFontTrueType");

	status = AbstractWrittenFont::WriteStateInDictionary(inStateWriter,writtenFontDictionary);
	if(PDFHummus::eSuccess == status)
	{
		inStateWriter->EndDictionary(writtenFontDictionary);
		inStateWriter->EndIndirectObject();

		status = AbstractWrittenFont::WriteStateAfterDictionary(inStateWriter);
	}
	return status;
}